

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_pwr.cpp
# Opt level: O1

uchar * sz_compress_2d_pwr<float>
                  (float *data,size_t r1,size_t r2,double precision,size_t *compressed_size,
                  int BSIZE,bool block_independant)

{
  float *pfVar1;
  uchar *intArray;
  long lVar2;
  uchar *__src;
  size_t __size;
  size_t __size_00;
  float fVar3;
  double dVar4;
  float fVar5;
  float fVar6;
  uchar *final_compressed_pos;
  size_t log_compressed_size;
  float local_88;
  float *local_40;
  size_t local_38;
  
  __size_00 = r2 * r1;
  pfVar1 = (float *)malloc(__size_00 * 4);
  intArray = (uchar *)malloc(__size_00);
  memset(intArray,0,__size_00);
  fVar5 = *data;
  fVar6 = fVar5;
  if (1 < __size_00) {
    lVar2 = 1;
    do {
      fVar3 = data[lVar2];
      if (fVar3 <= fVar6) {
        fVar6 = fVar3;
      }
      if (fVar5 <= fVar3) {
        fVar5 = fVar3;
      }
      lVar2 = lVar2 + 1;
    } while (__size_00 - lVar2 != 0);
  }
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    local_88 = log2f(ABS(fVar6));
    if ((fVar5 == 0.0) && (!NAN(fVar5))) goto LAB_00105e86;
    local_88 = ABS(local_88);
    fVar3 = log2f(ABS(fVar5));
    fVar5 = (float)(-(uint)(ABS(fVar3) < local_88) & (uint)ABS(fVar6) |
                   ~-(uint)(ABS(fVar3) < local_88) & (uint)ABS(fVar5));
  }
  else {
    fVar5 = ABS(fVar5);
  }
  local_88 = log2f(fVar5);
LAB_00105e86:
  fVar5 = ABS(local_88);
  if (__size_00 == 0) {
    local_88 = ABS(local_88);
  }
  else {
    lVar2 = 0;
    local_88 = ABS(local_88);
    fVar6 = fVar5;
    do {
      fVar3 = data[lVar2];
      if (fVar3 < 0.0) {
        intArray[lVar2] = '\x01';
        fVar3 = -fVar3;
      }
      pfVar1[lVar2] = fVar3;
      fVar5 = fVar6;
      if (0.0 < fVar3) {
        fVar3 = log2f(fVar3);
        pfVar1[lVar2] = fVar3;
        fVar5 = fVar3;
        if (fVar3 <= fVar6) {
          fVar5 = fVar6;
        }
        if (fVar3 < local_88) {
          local_88 = fVar3;
        }
      }
      lVar2 = lVar2 + 1;
      fVar6 = fVar5;
    } while (__size_00 - lVar2 != 0);
  }
  fVar6 = ABS(local_88);
  if (ABS(local_88) <= fVar5) {
    fVar6 = fVar5;
  }
  dVar4 = log2(precision + 1.0);
  dVar4 = (double)(fVar6 * -1.1920929e-07) + dVar4;
  if (__size_00 != 0) {
    lVar2 = 0;
    do {
      if ((data[lVar2] == 0.0) && (!NAN(data[lVar2]))) {
        pfVar1[lVar2] = (float)(dVar4 * -2.0001 + (double)local_88);
      }
      lVar2 = lVar2 + 1;
    } while (__size_00 - lVar2 != 0);
  }
  local_38 = 0;
  __src = sz_compress_2d<float>(pfVar1,r1,r2,dVar4,&local_38,BSIZE,block_independant);
  free(pfVar1);
  __size = (__size_00 - 1 >> 3) + local_38 + 5;
  *compressed_size = __size;
  pfVar1 = (float *)malloc(__size);
  *pfVar1 = (float)(dVar4 * -1.0001 + (double)local_88);
  local_40 = pfVar1 + 1;
  convertIntArray2ByteArray_fast_1b_to_result_sz(intArray,__size_00,(uchar **)&local_40);
  memcpy(local_40,__src,local_38);
  free(intArray);
  free(__src);
  return (uchar *)pfVar1;
}

Assistant:

unsigned char *
sz_compress_2d_pwr(const T * data, size_t r1, size_t r2, double precision, size_t& compressed_size, int BSIZE, bool block_independant){
	size_t num_elements = r1 * r2;
	T * log_data = (T *) malloc(num_elements * sizeof(T));

	unsigned char * signs = (unsigned char *) malloc(num_elements);
	memset(signs, 0, num_elements);
	// preprocess
	T min_data = data[0];
	T max_data = data[0];
	for(int i=1; i<num_elements; i++){
		min_data = MIN(min_data, data[i]);
		max_data = MAX(max_data, data[i]);
	}
	T max_abs_log_data = 0;
    if(min_data == 0) max_abs_log_data = fabs(log2(fabs(max_data)));
    else if(max_data == 0) max_abs_log_data = fabs(log2(fabs(min_data)));
    else max_abs_log_data = fabs(log2(fabs(min_data))) > fabs(log2(fabs(max_data))) ? fabs(log2(fabs(min_data))) : fabs(log2(fabs(max_data)));
    T min_log_data = max_abs_log_data;
	for(size_t i=0; i<num_elements; i++){
		if(data[i] < 0){
			signs[i] = 1;
			log_data[i] = -data[i];
		}
		else
			log_data[i] = data[i];
		if(log_data[i] > 0){
			log_data[i] = log2(log_data[i]);
			if(log_data[i] > max_abs_log_data) max_abs_log_data = log_data[i];
			if(log_data[i] < min_log_data) min_log_data = log_data[i];
		}
	}
	if(fabs(min_log_data) > max_abs_log_data) max_abs_log_data = fabs(min_log_data);
	double log_precision = log2(1.0 + precision) - max_abs_log_data * std::numeric_limits<T>::epsilon();
	for(size_t i=0; i<num_elements; i++){
		if(data[i] == 0){
			log_data[i] = min_log_data - 2.0001*log_precision;
		}
	}
	size_t log_compressed_size = 0;
	unsigned char * log_compressed = sz_compress_2d(log_data, r1, r2, log_precision, log_compressed_size, BSIZE, block_independant);
    free(log_data);
	size_t sign_size = (num_elements-1)/8 + 1;
	T threshold = min_log_data - 1.0001*log_precision;
	compressed_size = sizeof(T) + sign_size + log_compressed_size;
    unsigned char * final_compressed = (unsigned char *) malloc(compressed_size);
    unsigned char * final_compressed_pos = final_compressed;
    memcpy(final_compressed_pos, &threshold, sizeof(T));
    final_compressed_pos += sizeof(T);
	convertIntArray2ByteArray_fast_1b_to_result_sz(signs, num_elements, final_compressed_pos);
	memcpy(final_compressed_pos, log_compressed, log_compressed_size);
	free(signs);
	free(log_compressed);
	return final_compressed;
}